

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O2

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,t2<char,_int> *Val)

{
  long lVar1;
  byte bVar2;
  int in_EAX;
  size_t sVar3;
  long lVar4;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  lVar1 = 3;
  do {
    lVar4 = lVar1;
    bVar2 = (byte)in_EAX;
    if (NArgs <= lVar4) goto LAB_00107760;
    in_EAX = strncmp(Args[lVar4 + -2],Opt,0x20);
    lVar1 = lVar4 + 1;
  } while (in_EAX != 0);
  Val->First = *Args[lVar4 + -1];
  local_40 = (anon_union_8_2_2df48d06_for_stref_0)
             ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar4))->Ptr;
  sVar3 = strlen(local_40.Ptr);
  local_38 = (undefined4)sVar3;
  bVar2 = ToInt((stref *)&local_40,&Val->Second);
LAB_00107760:
  return (bool)(lVar4 < NArgs & bVar2);
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, t2<char, int>* Val)
{
  for (int I = 1; I + 2 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      Val->First = Args[I + 1][0];
      return ToInt(Args[I + 2], &Val->Second);
    }
  }

  return false;
}